

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::DestroySurface::exec(DestroySurface *this,Thread *t)

{
  _func_int **pp_Var1;
  deUint32 err;
  Thread *pTVar2;
  MessageBuilder *pMVar3;
  undefined1 local_1b0 [400];
  
  pTVar2 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar2 != (Thread *)0x0) {
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- eglDestroySurface(");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_display);
    std::operator<<((ostream *)&pMVar3->field_0x18,",  ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&((this->m_surface).m_ptr)->surface)
    ;
    std::operator<<((ostream *)&pMVar3->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    pp_Var1 = pTVar2[1].super_Thread._vptr_Thread;
    (**(code **)(*pp_Var1 + 0xb0))(pp_Var1,this->m_display,((this->m_surface).m_ptr)->surface);
    err = (**(code **)(*pTVar2[1].super_Thread._vptr_Thread + 0xf8))();
    eglu::checkError(err,"destroySurface(m_display, m_surface->surface)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                     ,0x358);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- eglDestroySurface()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DestroySurface::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- eglDestroySurface(" << m_display << ",  " << m_surface->surface << ")" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_CALL(thread.egl, destroySurface(m_display, m_surface->surface));
	thread.newMessage() << "End -- eglDestroySurface()" << tcu::ThreadUtil::Message::End;
}